

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseInt64(char *s,char *end,uint64_t *out,ParseIntType parse_type)

{
  Result RVar1;
  bool bVar2;
  uint64_t uStack_38;
  Result result;
  uint64_t value;
  bool has_sign;
  ParseIntType parse_type_local;
  uint64_t *out_local;
  char *end_local;
  char *s_local;
  
  bVar2 = false;
  if ((*s == '-') || (end_local = s, *s == '+')) {
    if (parse_type == UnsignedOnly) {
      Result::Result((Result *)((long)&s_local + 4),Error);
      return (Result)s_local._4_4_;
    }
    bVar2 = *s == '-';
    end_local = s + 1;
  }
  uStack_38 = 0;
  RVar1 = ParseUint64(end_local,end,&stack0xffffffffffffffc8);
  if (bVar2) {
    if (0x8000000000000000 < uStack_38) {
      Result::Result((Result *)((long)&s_local + 4),Error);
      return (Result)s_local._4_4_;
    }
    uStack_38 = -uStack_38;
  }
  *out = uStack_38;
  return (Result)RVar1.enum_;
}

Assistant:

Result ParseInt64(const char* s,
                  const char* end,
                  uint64_t* out,
                  ParseIntType parse_type) {
  bool has_sign = false;
  if (*s == '-' || *s == '+') {
    if (parse_type == ParseIntType::UnsignedOnly) {
      return Result::Error;
    }
    if (*s == '-') {
      has_sign = true;
    }
    s++;
  }
  uint64_t value = 0;
  Result result = ParseUint64(s, end, &value);
  if (has_sign) {
    // abs(INT64_MIN) == INT64_MAX + 1.
    if (value > static_cast<uint64_t>(INT64_MAX) + 1) {
      return Result::Error;
    }
    value = UINT64_MAX - value + 1;
  }
  *out = value;
  return result;
}